

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O0

int anon_unknown.dwarf_1e6e5::ChannelOut_omni(lua_State *L)

{
  int iVar1;
  int iVar2;
  ChannelOut *this;
  int xs_1;
  ChannelOut *self;
  lua_State *L_local;
  
  this = getChannelOut(L,1);
  iVar1 = this->index;
  iVar2 = lua_toboolean(L,2);
  xs_1 = 0x7c;
  if (iVar2 != 0) {
    xs_1 = 0x7d;
  }
  ChannelOut::send<int,int,int>(this,iVar1 + 0xb0,xs_1,0);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_omni(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	self.send(0xB0 + self.index, lua_toboolean(L, 2) ? 0x7D : 0x7C, 0x00);
	lua_settop(L, 1);
	return 1;
}